

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  uint uVar1;
  long in_RSI;
  ucvector PLTE;
  size_t i;
  uint error;
  ucvector *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  char *chunkName;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  
  uVar2 = 0;
  ucvector_init((ucvector *)&stack0xffffffffffffffc8);
  for (chunkName = (char *)0x0; chunkName != (char *)(*(long *)(in_RSI + 0x10) << 2);
      chunkName = chunkName + 1) {
    if (((ulong)chunkName & 3) != 3) {
      ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
    }
  }
  uVar1 = addChunk((ucvector *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),chunkName,
                   in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  ucvector_cleanup((void *)0x12014f);
  return uVar1;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info)
{
	unsigned error = 0;
	size_t i;
	ucvector PLTE;
	ucvector_init(&PLTE);
	for (i = 0; i != info->palettesize * 4; ++i)
	{
		/*add all channels except alpha channel*/
		if (i % 4 != 3) ucvector_push_back(&PLTE, info->palette[i]);
	}
	error = addChunk(out, "PLTE", PLTE.data, PLTE.size);
	ucvector_cleanup(&PLTE);

	return error;
}